

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

int Ivy_FraigRefineClasses(Ivy_FraigMan_t *p)

{
  Ivy_Obj_t *pIVar1;
  int iVar2;
  abctime aVar3;
  Ivy_Obj_t *pIVar4;
  abctime aVar5;
  Ivy_Obj_t *pClass;
  int iVar6;
  
  if (p->pParams->fProve != 0) {
    Ivy_FraigCheckOutputSims(p);
  }
  iVar6 = 0;
  if (p->pManFraig->pData == (void *)0x0) {
    aVar3 = Abc_Clock();
    pClass = (p->lClasses).pHead;
    iVar6 = 0;
    if (pClass != (Ivy_Obj_t *)0x0) goto LAB_005f1825;
    pIVar1 = (Ivy_Obj_t *)0x0;
    while (pIVar4 = pIVar1, pClass != (Ivy_Obj_t *)0x0) {
      if ((pClass->field_0x8 & 0x10) == 0) {
        iVar2 = Ivy_FraigRefineClass_rec(p,pClass);
        iVar6 = iVar6 + (uint)(0 < iVar2);
      }
      pIVar1 = (Ivy_Obj_t *)0x0;
      pClass = pIVar4;
      if (pIVar4 != (Ivy_Obj_t *)0x0) {
LAB_005f1825:
        pIVar1 = pClass->pPrevFan0;
      }
    }
    aVar5 = Abc_Clock();
    p->timeRef = p->timeRef + (aVar5 - aVar3);
  }
  return iVar6;
}

Assistant:

int Ivy_FraigRefineClasses( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pClass, * pClass2;
    int RetValue, Counter = 0;
    abctime clk;
    // check if some outputs already became non-constant
    // this is a special case when computation can be stopped!!!
    if ( p->pParams->fProve )
        Ivy_FraigCheckOutputSims( p );
    if ( p->pManFraig->pData )
        return 0;
    // refine the classed
clk = Abc_Clock();
    Ivy_FraigForEachEquivClassSafe( p->lClasses.pHead, pClass, pClass2 )
    {
        if ( pClass->fMarkA )
            continue;
        RetValue = Ivy_FraigRefineClass_rec( p, pClass );
        Counter += ( RetValue > 0 );
//if ( Ivy_ObjIsConst1(pClass) )
//printf( "%d ", RetValue );
//if ( Ivy_ObjIsConst1(pClass) )
//    p->time1 += Abc_Clock() - clk;
    }
p->timeRef += Abc_Clock() - clk;
    return Counter;
}